

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::parseICC(LodePNGICC *icc,uchar *data,size_t size)

{
  ulong uVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  ushort uVar5;
  long lVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  LodePNGICCCurve *pLVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t pos;
  ulong uVar17;
  float fVar18;
  float fVar19;
  
  uVar9 = 1;
  if (0x83 < size) {
    uVar9 = 0;
    icc->has_chad = 0;
    icc->trc[2].type = 0;
    icc->trc[1].type = 0;
    icc->has_whitepoint = 0;
    icc->white[0] = 0.0;
    icc->white[1] = 0.0;
    icc->white[2] = 0.0;
    icc->has_chromaticity = 0;
    icc->red[0] = 0.0;
    icc->red[1] = 0.0;
    icc->red[2] = 0.0;
    icc->green[0] = 0.0;
    icc->green[1] = 0.0;
    *(undefined8 *)(icc->green + 2) = 0;
    icc->blue[1] = 0.0;
    icc->blue[2] = 0.0;
    icc->has_trc = 0;
    icc->trc[0].type = 0;
    bVar2 = data[9];
    icc->version_major = (uint)data[8];
    icc->version_minor = (uint)(bVar2 >> 4);
    icc->version_bugfix = bVar2 & 0xf;
    uVar8 = *(uint *)(data + 0x10);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    iVar12 = (uint)(uVar8 == 0x52474220) * 2;
    if (uVar8 == 0x47524159) {
      iVar12 = 1;
    }
    icc->inputspace = iVar12;
    uVar8 = *(uint *)(data + 0x44);
    icc->illuminant[0] =
         (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) * 1.5258789e-05;
    uVar8 = *(uint *)(data + 0x48);
    icc->illuminant[1] =
         (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) * 1.5258789e-05;
    uVar8 = *(uint *)(data + 0x4c);
    icc->illuminant[2] =
         (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) * 1.5258789e-05;
    if (size == 0x84) {
LAB_0011bfb4:
      uVar9 = 1;
    }
    else {
      uVar15 = (ulong)data[0x81] << 0x10 | (ulong)data[0x80] << 0x18;
      uVar3 = data[0x82];
      uVar4 = data[0x83];
      if ((uVar15 != 0 || uVar3 != '\0') || uVar4 != '\0') {
        uVar13 = 0;
        pos = 0x84;
        do {
          if (size < pos + 8) {
            uVar14 = 0;
          }
          else {
            uVar9 = *(uint *)(data + pos + 4);
            uVar14 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                            uVar9 << 0x18);
          }
          uVar1 = pos + 0xc;
          uVar9 = 0;
          if (uVar1 <= size) {
            uVar9 = *(uint *)(data + pos + 8);
            uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          }
          if ((((size <= uVar1) || (uVar9 < 8)) || (size <= uVar14)) || (size < uVar9 + uVar14))
          goto LAB_0011bfb4;
          bVar2 = data[pos];
          if (bVar2 < 0x72) {
            if (bVar2 == 0x62) {
              if (((data[pos + 1] != 'X') || (data[pos + 2] != 'Y')) || (data[pos + 3] != 'Z'))
              goto LAB_0011c386;
              fVar18 = 0.0;
              fVar19 = 0.0;
              if (uVar14 + 0xc <= size) {
                uVar9 = *(uint *)(data + uVar14 + 8);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->blue[0] = fVar19;
              if (uVar14 + 0x10 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0xc);
                fVar18 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->blue[1] = fVar18;
              fVar19 = 0.0;
              if (uVar14 + 0x14 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0x10);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->blue[2] = fVar19;
            }
            else {
              if (((bVar2 != 0x67) || (data[pos + 1] != 'X')) ||
                 ((data[pos + 2] != 'Y' || (data[pos + 3] != 'Z')))) goto LAB_0011c386;
              fVar18 = 0.0;
              fVar19 = 0.0;
              if (uVar14 + 0xc <= size) {
                uVar9 = *(uint *)(data + uVar14 + 8);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->green[0] = fVar19;
              if (uVar14 + 0x10 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0xc);
                fVar18 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->green[1] = fVar18;
              fVar19 = 0.0;
              if (uVar14 + 0x14 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0x10);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->green[2] = fVar19;
            }
LAB_0011c37c:
            icc->has_chromaticity = 1;
            uVar11 = uVar14 + 0x14;
          }
          else {
            if (bVar2 == 0x72) {
              if (((data[pos + 1] == 'X') && (data[pos + 2] == 'Y')) && (data[pos + 3] == 'Z')) {
                fVar18 = 0.0;
                fVar19 = 0.0;
                if (uVar14 + 0xc <= size) {
                  uVar9 = *(uint *)(data + uVar14 + 8);
                  fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                        (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
                }
                icc->red[0] = fVar19;
                if (uVar14 + 0x10 <= size) {
                  uVar9 = *(uint *)(data + uVar14 + 0xc);
                  fVar18 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                        (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
                }
                icc->red[1] = fVar18;
                fVar19 = 0.0;
                if (uVar14 + 0x14 <= size) {
                  uVar9 = *(uint *)(data + uVar14 + 0x10);
                  fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                        (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
                }
                icc->red[2] = fVar19;
                goto LAB_0011c37c;
              }
            }
            else if (((bVar2 == 0x77) && (data[pos + 1] == 't')) &&
                    ((data[pos + 2] == 'p' && (data[pos + 3] == 't')))) {
              fVar18 = 0.0;
              fVar19 = 0.0;
              if (uVar14 + 0xc <= size) {
                uVar9 = *(uint *)(data + uVar14 + 8);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->white[0] = fVar19;
              if (uVar14 + 0x10 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0xc);
                fVar18 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->white[1] = fVar18;
              fVar19 = 0.0;
              if (uVar14 + 0x14 <= size) {
                uVar9 = *(uint *)(data + uVar14 + 0x10);
                fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
              }
              icc->white[2] = fVar19;
              icc->has_whitepoint = 1;
              uVar11 = uVar14 + 0x14;
              goto LAB_0011c3fb;
            }
LAB_0011c386:
            uVar9 = isICCword(data,size,pos,"chad");
            if (uVar9 == 0) {
              uVar9 = isICCword(data,size,pos,"rTRC");
              if (((uVar9 != 0) || (uVar9 = isICCword(data,size,pos,"gTRC"), uVar9 != 0)) ||
                 ((uVar9 = isICCword(data,size,pos,"bTRC"), uVar9 != 0 ||
                  (uVar9 = isICCword(data,size,pos,"kTRC"), uVar11 = uVar14, uVar9 != 0)))) {
                uVar16 = (ulong)(data[pos] == 'g');
                if (data[pos] == 'b') {
                  uVar16 = 2;
                }
                uVar9 = isICCword(data,size,uVar14,"curv");
                if (uVar9 != 0) {
                  pLVar10 = icc->trc + uVar16;
                  icc->has_trc = 1;
                  uVar11 = uVar14 + 0xc;
                  if (size < uVar11) {
LAB_0011c4e2:
                    pLVar10->type = 0;
                    uVar14 = uVar11;
                  }
                  else {
                    uVar9 = *(uint *)(data + uVar14 + 8);
                    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                            uVar9 << 0x18;
                    uVar17 = (ulong)uVar9;
                    if (uVar9 == 1) {
                      pLVar10->type = 2;
                      uVar14 = uVar14 + 0xe;
                      fVar19 = 0.0;
                      if (uVar14 <= size) {
                        fVar19 = (float)(ushort)(*(ushort *)(data + uVar11) << 8 |
                                                *(ushort *)(data + uVar11) >> 8) * 0.00390625;
                      }
                      pLVar10->gamma = fVar19;
                    }
                    else {
                      if (uVar9 == 0) goto LAB_0011c4e2;
                      pLVar10->type = 1;
                      if ((0x1000000 < uVar9) || (size < uVar17 * 2 + uVar11)) goto LAB_0011bfb4;
                      pLVar10->lut_size = uVar17;
                      pfVar7 = (float *)malloc(uVar17 * 4);
                      pLVar10->lut = pfVar7;
                      do {
                        uVar14 = uVar11 + 2;
                        fVar19 = 0.0;
                        if (uVar14 <= size) {
                          fVar19 = (float)(ushort)(*(ushort *)(data + uVar11) << 8 |
                                                  *(ushort *)(data + uVar11) >> 8) * 1.5259022e-05;
                        }
                        *pfVar7 = fVar19;
                        pfVar7 = pfVar7 + 1;
                        uVar17 = uVar17 - 1;
                        uVar11 = uVar14;
                      } while (uVar17 != 0);
                    }
                  }
                }
                uVar9 = isICCword(data,size,uVar14,"para");
                uVar11 = uVar14;
                if (uVar9 != 0) {
                  icc->has_trc = 1;
                  uVar9 = 0;
                  if (uVar14 + 10 <= size) {
                    uVar5 = *(ushort *)(data + uVar14 + 8) << 8 |
                            *(ushort *)(data + uVar14 + 8) >> 8;
                    if (4 < uVar5) goto LAB_0011bfb4;
                    uVar9 = (uint)uVar5;
                  }
                  pLVar10 = icc->trc + uVar16;
                  pLVar10->type = uVar9 + 2;
                  uVar11 = uVar14 + 0x10;
                  fVar19 = 0.0;
                  if (uVar11 <= size) {
                    uVar8 = *(uint *)(data + uVar14 + 0xc);
                    fVar19 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                          (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
                  }
                  pLVar10->gamma = fVar19;
                  if (uVar9 != 0) {
                    fVar18 = 0.0;
                    fVar19 = 0.0;
                    if (uVar14 + 0x14 <= size) {
                      uVar8 = *(uint *)(data + uVar11);
                      fVar19 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                            (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
                    }
                    pLVar10->a = fVar19;
                    uVar16 = uVar14 + 0x18;
                    if (uVar16 <= size) {
                      uVar8 = *(uint *)(data + uVar14 + 0x14);
                      fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                            (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
                    }
                    pLVar10->b = fVar18;
                    uVar11 = uVar16;
                    if (uVar9 != 1) {
                      uVar11 = uVar14 + 0x1c;
                      fVar19 = 0.0;
                      if (uVar11 <= size) {
                        uVar8 = *(uint *)(data + uVar16);
                        fVar19 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                              (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05
                        ;
                      }
                      pLVar10->c = fVar19;
                      if (2 < uVar9) {
                        uVar16 = uVar14 + 0x20;
                        fVar19 = 0.0;
                        if (uVar16 <= size) {
                          uVar8 = *(uint *)(data + uVar11);
                          fVar19 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                                (uVar8 & 0xff00) << 8 | uVar8 << 0x18) *
                                   1.5258789e-05;
                        }
                        pLVar10->d = fVar19;
                        uVar11 = uVar16;
                        if (uVar9 == 4) {
                          fVar18 = 0.0;
                          fVar19 = 0.0;
                          if (uVar14 + 0x24 <= size) {
                            uVar9 = *(uint *)(data + uVar16);
                            fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                                  (uVar9 & 0xff00) << 8 | uVar9 << 0x18) *
                                     1.5258789e-05;
                          }
                          pLVar10->e = fVar19;
                          if (uVar14 + 0x28 <= size) {
                            uVar9 = *(uint *)(data + uVar14 + 0x24);
                            fVar18 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                                  (uVar9 & 0xff00) << 8 | uVar9 << 0x18) *
                                     1.5258789e-05;
                          }
                          pLVar10->f = fVar18;
                          uVar11 = uVar14 + 0x28;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              lVar6 = 9;
              pfVar7 = icc->chad;
              uVar14 = uVar14 + 8;
              do {
                uVar11 = uVar14 + 4;
                fVar19 = 0.0;
                if (uVar11 <= size) {
                  uVar9 = *(uint *)(data + uVar14);
                  fVar19 = (float)(int)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                        (uVar9 & 0xff00) << 8 | uVar9 << 0x18) * 1.5258789e-05;
                }
                *pfVar7 = fVar19;
                pfVar7 = pfVar7 + 1;
                lVar6 = lVar6 + -1;
                uVar14 = uVar11;
              } while (lVar6 != 0);
              icc->has_chad = 1;
            }
          }
LAB_0011c3fb:
          if (size < uVar11) goto LAB_0011bfb4;
          uVar13 = uVar13 + 1;
          pos = uVar1;
        } while (uVar13 != (uVar15 | CONCAT11(uVar3,uVar4)));
        uVar9 = 0;
      }
    }
  }
  return uVar9;
}

Assistant:

static unsigned parseICC(LodePNGICC* icc, const unsigned char* data, size_t size) {
  size_t i, j;
  size_t pos = 0;
  unsigned version;
  unsigned inputspace;
  size_t numtags;

  if(size < 132) return 1; /* Too small to be a valid icc profile. */

  icc->has_chromaticity = 0;
  icc->has_whitepoint = 0;
  icc->has_trc = 0;
  icc->has_chad = 0;

  icc->trc[0].type = icc->trc[1].type = icc->trc[2].type = 0;
  icc->white[0] = icc->white[1] = icc->white[2] = 0;
  icc->red[0] = icc->red[1] = icc->red[2] = 0;
  icc->green[0] = icc->green[1] = icc->green[2] = 0;
  icc->blue[0] = icc->blue[1] = icc->blue[2] = 0;

  pos = 8;
  version = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  icc->version_major = (int)((version >> 24) & 255);
  icc->version_minor = (int)((version >> 20) & 15);
  icc->version_bugfix = (int)((version >> 16) & 15);

  pos = 16;
  inputspace = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  if(inputspace == 0x47524159) {
    /* The string  "GRAY" as unsigned 32-bit int. */
    icc->inputspace = 1;
  } else if(inputspace == 0x52474220) {
    /* The string  "RGB " as unsigned 32-bit int. */
    icc->inputspace = 2;
  } else {
    /* unsupported by PNG (CMYK, YCbCr, Lab, HSV, ...) */
    icc->inputspace = 0;
  }

  /* Should always be 0.9642, 1.0, 0.8249 */
  pos = 68;
  icc->illuminant[0] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[1] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[2] = decodeICC15Fixed16(data, size, &pos);

  pos = 128;
  numtags = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  /* scan for tags we want to handle */
  for(i = 0; i < numtags; i++) {
    size_t offset;
    unsigned tagsize;
    size_t namepos = pos;
    pos += 4;
    offset = decodeICCUint32(data, size, &pos);
    tagsize = decodeICCUint32(data, size, &pos);
    if(pos >= size || offset >= size) return 1;
    if(offset + tagsize > size) return 1;
    if(tagsize < 8) return 1;

    if(isICCword(data, size, namepos, "wtpt")) {
      offset += 8; /* skip tag and reserved */
      icc->white[0] = decodeICC15Fixed16(data, size, &offset);
      icc->white[1] = decodeICC15Fixed16(data, size, &offset);
      icc->white[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_whitepoint = 1;
    } else if(isICCword(data, size, namepos, "rXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->red[0] = decodeICC15Fixed16(data, size, &offset);
      icc->red[1] = decodeICC15Fixed16(data, size, &offset);
      icc->red[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "gXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->green[0] = decodeICC15Fixed16(data, size, &offset);
      icc->green[1] = decodeICC15Fixed16(data, size, &offset);
      icc->green[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "bXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->blue[0] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[1] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "chad")) {
      offset += 8; /* skip datatype keyword "sf32" and reserved */
      for(j = 0; j < 9; j++) {
        icc->chad[j] = decodeICC15Fixed16(data, size, &offset);
      }
      icc->has_chad = 1;
    } else if(isICCword(data, size, namepos, "rTRC") ||
              isICCword(data, size, namepos, "gTRC") ||
              isICCword(data, size, namepos, "bTRC") ||
              isICCword(data, size, namepos, "kTRC")) {
      char c = (char)data[namepos];
      /* both 'k' and 'r' are stored in channel 0 */
      int channel = (c == 'b') ? 2 : (c == 'g' ? 1 : 0);
      /* "curv": linear, gamma power or LUT */
      if(isICCword(data, size, offset, "curv")) {
        size_t count;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "curv" and reserved */
        count = decodeICCUint32(data, size, &offset);
        if(count == 0) {
          trc->type = 0; /* linear */
        } else if(count == 1) {
          trc->type = 2; /* gamma */
          trc->gamma = decodeICCUint16(data, size, &offset) / 256.0f;
        } else {
          trc->type = 1; /* LUT */
          if(offset + count * 2 > size || count > 16777216) return 1; /* also avoid crazy count */
          trc->lut_size = count;
          trc->lut = (float*)lodepng_malloc(count * sizeof(float));
          for(j = 0; j < count; j++) {
            trc->lut[j] = decodeICCUint16(data, size, &offset) * (1.0f / 65535.0f);
          }
        }
      }
      /* "para": parametric formula with gamma power, multipliers, biases and comparison point */
      /* TODO: test this on a realistic sample */
      if(isICCword(data, size, offset, "para")) {
        unsigned type;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "para" and reserved */
        type = decodeICCUint16(data, size, &offset);
        offset += 2;
        if(type > 4) return 1; /* unknown parametric curve type */
        trc->type = type + 2;
        trc->gamma = decodeICC15Fixed16(data, size, &offset);
        if(type >= 1) {
          trc->a = decodeICC15Fixed16(data, size, &offset);
          trc->b = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 2) {
          trc->c = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 3) {
          trc->d = decodeICC15Fixed16(data, size, &offset);
        }
        if(type == 4) {
          trc->e = decodeICC15Fixed16(data, size, &offset);
          trc->f = decodeICC15Fixed16(data, size, &offset);
        }
      }
      /* TODO: verify: does the "chrm" tag participate in computation so should be parsed? */
    }
    /* Return error if any parse went beyond the filesize. Note that the
    parsing itself was always safe since it bound-checks inside. */
    if(offset > size) return 1;
  }

  return 0;
}